

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O0

bool slang::ast::checkFormatString
               (ASTContext *context,StringLiteral *arg,iterator *argIt,iterator argEnd)

{
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  onArg;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> onText;
  bool bVar1;
  size_type sVar2;
  iterator *in_RDX;
  StringLiteral *in_RSI;
  ASTContext *in_RDI;
  bool parseOk;
  bool ok;
  anon_class_8_1_ba1d5ea0 getRange;
  SourceLocation loc;
  string_view fmt;
  intptr_t in_stack_000000f8;
  undefined1 in_stack_00000100 [16];
  undefined1 in_stack_00000120 [16];
  undefined8 in_stack_ffffffffffffff10;
  int delta;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  bool bVar3;
  ASTContext *in_stack_ffffffffffffff20;
  anon_class_8_1_ba1d5ea0 *in_stack_ffffffffffffff28;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  anon_class_40_5_766a4b66 local_c0;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  local_98;
  anon_class_1_0_00000001 local_81;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)> local_80;
  size_t local_70;
  char *local_68;
  bool local_59;
  anon_class_8_1_ba1d5ea0 local_58;
  SourceLocation local_50;
  SourceLocation local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  string_view local_30;
  iterator *local_20;
  StringLiteral *local_18;
  ASTContext *local_10;
  iterator local_8;
  
  delta = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = StringLiteral::getRawValue(in_RSI);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
  if (1 < sVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
                          (size_type)in_stack_ffffffffffffff20);
    local_30 = local_40;
  }
  local_50 = SourceRange::start(&(local_18->super_Expression).sourceRange);
  local_48 = SourceLocation::operator+<int>
                       ((SourceLocation *)
                        CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),delta);
  local_58.loc = &local_48;
  local_59 = true;
  local_70 = local_30._M_len;
  local_68 = local_30._M_str;
  function_ref<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:119:14)>
            (&local_80,&local_81);
  local_c0.getRange = &local_58;
  local_c0.argIt = local_20;
  local_c0.argEnd = &local_8;
  local_c0.context = local_10;
  local_c0.ok = &local_59;
  function_ref<void_(char,_unsigned_long,_unsigned_long,_const_slang::ast::SFormat::FormatOptions_&)>
  ::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:120:9)>
            (&local_98,&local_c0);
  function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>::
  function_ref<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_FmtHelpers_cpp:148:9)>
            ((function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
              *)&stack0xffffffffffffff30,(anon_class_16_2_c565372f *)&stack0xffffffffffffff20);
  onText.callable = in_stack_000000f8;
  onText.callback =
       (_func_void_intptr_t_basic_string_view<char,_std::char_traits<char>_> *)argEnd._M_current;
  onArg.callable = (intptr_t)context;
  onArg.callback = (_func_void_intptr_t_char_unsigned_long_unsigned_long_FormatOptions_ptr *)arg;
  bVar1 = SFormat::parse((string_view)in_stack_00000100,onText,onArg,
                         (function_ref<void_(slang::DiagCode,_unsigned_long,_unsigned_long,_std::optional<char>)>
                          )in_stack_00000120);
  bVar3 = false;
  if ((local_59 & 1U) != 0) {
    bVar3 = bVar1;
  }
  return bVar3;
}

Assistant:

static bool checkFormatString(const ASTContext& context, const StringLiteral& arg,
                              Args::iterator& argIt, Args::iterator argEnd) {
    // Strip quotes from the raw string.
    std::string_view fmt = arg.getRawValue();
    if (fmt.length() >= 2)
        fmt = fmt.substr(1, fmt.length() - 2);

    SourceLocation loc = arg.sourceRange.start() + 1;
    auto getRange = [&](size_t offset, size_t len) {
        SourceLocation sl = loc + offset;
        return SourceRange{sl, sl + len};
    };

    bool ok = true;
    bool parseOk = SFormat::parse(
        fmt, [](std::string_view) {},
        [&](char spec, size_t offset, size_t len, const SFormat::FormatOptions&) {
            // Filter out non-consuming arguments.
            switch (charToLower(spec)) {
                case 'l':
                case 'm':
                    return;
                default:
                    break;
            }

            SourceRange range = getRange(offset, len);
            if (argIt == argEnd) {
                // If we've run out of arguments, this is an error.
                context.addDiag(diag::FormatNoArgument, range) << spec;
                ok = false;
                return;
            }

            auto arg = *argIt++;
            if (arg->kind == ExpressionKind::EmptyArgument) {
                // Empty arguments aren't allowed for format args.
                context.addDiag(diag::FormatEmptyArg, arg->sourceRange) << spec << range;
                ok = false;
                return;
            }

            ok &= checkArgType(context, *arg, spec, range);
        },
        [&](DiagCode code, size_t offset, size_t len, std::optional<char> specifier) {
            auto& diag = context.addDiag(code, getRange(offset, len));
            if (specifier)
                diag << *specifier;
        });

    return ok && parseOk;
}